

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O2

type_conflict2
jsoncons::detail::
encode_base64_generic<unsigned_char_const*,jsoncons::string_sink<std::__cxx11::string>>
          (uchar *first,uchar *last,char *alphabet,
          string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *result)

{
  char ch;
  ulong uVar1;
  long lVar2;
  type_conflict2 tVar3;
  long lVar4;
  ulong uVar5;
  byte *pbVar6;
  long lVar7;
  bool bVar8;
  long lStack_50;
  uchar uStack_41;
  uchar a3 [3];
  uchar a4 [4];
  
  ch = alphabet[0x40];
  lVar2 = 0;
  tVar3 = 0;
  lStack_50 = 1;
  while (lVar7 = lStack_50, first + lVar7 + -1 != last) {
    a3[lVar7 + -1] = first[lVar7 + -1];
    lStack_50 = lVar7 + 1;
    if ((int)(lVar7 + 1) == 4) {
      a4[0] = a3[0] >> 2;
      a4[1] = (a3[0] & 3) << 4 | a3[1] >> 4;
      a4[2] = (a3[1] & 0xf) << 2 | a3[2] >> 6;
      a4[3] = a3[2] & 0x3f;
      first = first + lVar7;
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::push_back(result,alphabet[a4[lVar7]]);
      }
      tVar3 = tVar3 + 4;
      lVar2 = lVar2 + -4;
      lStack_50 = 1;
    }
  }
  if ((int)lVar7 != 1) {
    uVar5 = lVar7 - 1;
    for (uVar1 = uVar5; (int)uVar1 < 3; uVar1 = uVar1 + 1) {
      a3[uVar1] = '\0';
    }
    pbVar6 = a4;
    a4[0] = a3[0] >> 2;
    a4[1] = (a3[0] & 3) << 4 | a3[1] >> 4;
    a4[2] = (a3[1] & 0xf) << 2 | a3[2] >> 6;
    lVar4 = lVar7;
    while (bVar8 = lVar4 != 0, lVar4 = lVar4 + -1, bVar8) {
      string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::push_back(result,alphabet[*pbVar6]);
      pbVar6 = pbVar6 + 1;
    }
    tVar3 = lVar7 - lVar2;
    if (ch != '\0') {
      for (; (uint)uVar5 < 3; uVar5 = (ulong)((uint)uVar5 + 1)) {
        string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::push_back(result,ch);
        tVar3 = tVar3 + 1;
      }
    }
  }
  return tVar3;
}

Assistant:

typename std::enable_if<std::is_same<typename std::iterator_traits<InputIt>::value_type,uint8_t>::value,size_t>::type
    encode_base64_generic(InputIt first, InputIt last, const char alphabet[65], Container& result)
    {
        std::size_t count = 0;
        unsigned char a3[3];
        unsigned char a4[4];
        unsigned char fill = alphabet[64];
        int i = 0;
        int j = 0;

        while (first != last)
        {
            a3[i++] = *first++;
            if (i == 3)
            {
                a4[0] = (a3[0] & 0xfc) >> 2;
                a4[1] = ((a3[0] & 0x03) << 4) + ((a3[1] & 0xf0) >> 4);
                a4[2] = ((a3[1] & 0x0f) << 2) + ((a3[2] & 0xc0) >> 6);
                a4[3] = a3[2] & 0x3f;

                for (i = 0; i < 4; i++) 
                {
                    result.push_back(alphabet[a4[i]]);
                    ++count;
                }
                i = 0;
            }
        }

        if (i > 0)
        {
            for (j = i; j < 3; ++j) 
            {
                a3[j] = 0;
            }

            a4[0] = (a3[0] & 0xfc) >> 2;
            a4[1] = ((a3[0] & 0x03) << 4) + ((a3[1] & 0xf0) >> 4);
            a4[2] = ((a3[1] & 0x0f) << 2) + ((a3[2] & 0xc0) >> 6);

            for (j = 0; j < i + 1; ++j) 
            {
                result.push_back(alphabet[a4[j]]);
                ++count;
            }

            if (fill != 0)
            {
                while (i++ < 3) 
                {
                    result.push_back(fill);
                    ++count;
                }
            }
        }

        return count;
    }